

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_broadcast_inner<ncnn::BinaryOp_x86_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float fVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  __m128 afVar3;
  __m128 _outp_4;
  __m128 _p_4;
  int i_4;
  __m128 _b_128_4;
  float _b_4;
  int y_2;
  float *ptr1_2;
  int z_1;
  int size_4;
  float *outptr_4;
  float *ptr_4;
  int q_3;
  __m128 _outp_3;
  __m128 _p_3;
  int i_3;
  __m128 _b_128_3;
  float _b_3;
  int z;
  int size_3;
  float *outptr_3;
  float *ptr1_1;
  float *ptr_3;
  int q_2;
  __m128 _outp_2;
  __m128 _p_2;
  int i_2;
  __m128 _b_128_2;
  float _b_2;
  int y_1;
  int size_2;
  float *outptr_2;
  float *ptr1;
  float *ptr_2;
  int q_1;
  __m128 _outp_1;
  __m128 _p_1;
  int i_1;
  int size_1;
  __m128 _b_128_1;
  float _b_1;
  float *outptr_1;
  float *ptr_1;
  int q;
  __m128 _outp;
  __m128 _p;
  int i;
  int size;
  __m128 _b_128;
  float _b;
  float *outptr;
  float *ptr;
  int y;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_add op;
  Mat *m_8;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  float local_eb8 [2];
  float afStack_eb0 [34];
  float local_e28 [2];
  float afStack_e20 [22];
  float local_dc8 [2];
  float afStack_dc0 [22];
  float local_d68 [2];
  float afStack_d60 [22];
  float local_d08 [2];
  float afStack_d00 [4];
  undefined8 uStack_cf0;
  float local_ce8 [2];
  float afStack_ce0 [5];
  int local_ccc;
  float local_cc8 [2];
  float afStack_cc0 [5];
  float local_cac;
  int local_ca8;
  undefined8 local_c98;
  undefined8 local_c90;
  undefined8 local_c88;
  undefined4 local_c80;
  long local_c78;
  undefined4 local_c70;
  undefined4 local_c6c;
  undefined4 local_c68;
  undefined4 local_c64;
  undefined4 local_c60;
  undefined8 local_c58;
  long local_c50;
  int local_c48;
  int local_c44;
  undefined8 local_c40;
  undefined8 local_c38;
  undefined8 local_c30;
  undefined4 local_c28;
  long local_c20;
  undefined4 local_c18;
  undefined4 local_c14;
  undefined4 local_c10;
  undefined4 local_c0c;
  undefined4 local_c08;
  undefined8 local_c00;
  float *local_bf8;
  undefined8 local_bf0;
  undefined8 local_be8;
  undefined8 local_be0;
  undefined4 local_bd8;
  long local_bd0;
  undefined4 local_bc8;
  undefined4 local_bc4;
  undefined4 local_bc0;
  undefined4 local_bbc;
  undefined4 local_bb8;
  undefined8 local_bb0;
  float *local_ba8;
  int local_b9c;
  undefined1 local_b98 [16];
  float local_b88 [2];
  float afStack_b80 [5];
  int local_b6c;
  float local_b68 [2];
  float afStack_b60 [3];
  float local_b54;
  int local_b50;
  int local_b4c;
  undefined8 local_b48;
  undefined8 local_b40;
  undefined8 local_b38;
  undefined4 local_b30;
  long local_b28;
  undefined4 local_b20;
  undefined4 local_b1c;
  undefined4 local_b18;
  undefined4 local_b14;
  undefined4 local_b10;
  undefined8 local_b08;
  float *local_b00;
  long local_af8;
  undefined8 local_af0;
  undefined8 local_ae8;
  undefined8 local_ae0;
  undefined4 local_ad8;
  long local_ad0;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined8 local_ab0;
  float *local_aa8;
  int local_a9c;
  undefined1 local_a98 [16];
  float local_a88 [2];
  float afStack_a80 [5];
  int local_a6c;
  float local_a68 [2];
  float afStack_a60 [3];
  float local_a54;
  int local_a50;
  int local_a4c;
  undefined8 local_a48;
  undefined8 local_a40;
  undefined8 local_a38;
  undefined4 local_a30;
  long local_a28;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined8 local_a08;
  float *local_a00;
  long local_9f8;
  undefined8 local_9f0;
  undefined8 local_9e8;
  undefined8 local_9e0;
  undefined4 local_9d8;
  long local_9d0;
  undefined4 local_9c8;
  undefined4 local_9c4;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined8 local_9b0;
  float *local_9a8;
  int local_99c;
  undefined1 local_998 [16];
  float local_988 [2];
  float afStack_980 [4];
  int local_970;
  int local_96c;
  float local_968 [2];
  float afStack_960 [3];
  float local_954;
  undefined8 local_950;
  undefined8 local_948;
  undefined8 local_940;
  undefined4 local_938;
  long local_930;
  undefined4 local_928;
  undefined4 local_924;
  undefined4 local_920;
  undefined4 local_91c;
  undefined4 local_918;
  undefined8 local_910;
  float *local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined4 local_8e8;
  long local_8e0;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined8 local_8c0;
  float *local_8b8;
  int local_8ac;
  undefined1 local_8a8 [16];
  float local_898 [2];
  float afStack_890 [4];
  int local_880;
  int local_87c;
  float local_878 [2];
  float afStack_870 [5];
  float local_85c;
  float *local_858;
  float *local_850;
  int local_844;
  int local_840;
  int local_83c;
  int local_838;
  int local_834;
  int local_830;
  binary_op_add local_829 [9];
  long *local_820;
  long *local_818;
  long *local_810;
  long local_808;
  long local_7f8;
  long *local_7f0;
  undefined1 local_7e5;
  int local_7e4;
  undefined8 *local_7d8;
  undefined1 local_7cd;
  int local_7cc;
  undefined8 *local_7c0;
  undefined1 local_7b5;
  int local_7b4;
  undefined8 *local_7a8;
  undefined1 local_79d;
  int local_79c;
  undefined8 *local_790;
  undefined1 local_785;
  int local_784;
  undefined8 *local_778;
  undefined8 *local_770;
  undefined8 *local_768;
  undefined8 *local_760;
  undefined8 *local_750;
  long *local_748;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  undefined8 *local_6f0;
  undefined8 *local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  undefined1 local_6c5;
  int local_6c4;
  undefined8 *local_6b8;
  undefined1 local_6a5;
  int local_6a4;
  undefined8 *local_698;
  undefined1 local_685;
  int local_684;
  undefined8 *local_678;
  undefined1 local_665;
  int local_664;
  undefined8 *local_658;
  undefined8 *local_648;
  undefined8 *local_640;
  undefined8 *local_638;
  undefined8 *local_630;
  float local_628;
  float fStack_624;
  float fStack_620;
  float fStack_61c;
  float local_618;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  float local_5f8;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float local_5c8;
  float fStack_5c4;
  float fStack_5c0;
  float fStack_5bc;
  float local_5b8;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  float local_598;
  long local_588;
  undefined4 local_57c;
  long local_578;
  float *local_570;
  undefined4 local_564;
  int local_560;
  int local_55c;
  undefined8 *local_558;
  long local_550;
  undefined4 local_544;
  long local_540;
  float *local_538;
  undefined4 local_52c;
  int local_528;
  int local_524;
  undefined8 *local_520;
  long local_518;
  undefined4 local_50c;
  long local_508;
  float *local_500;
  undefined4 local_4f4;
  int local_4f0;
  int local_4ec;
  undefined8 *local_4e8;
  long local_4e0;
  undefined4 local_4d4;
  long local_4d0;
  float *local_4c8;
  undefined4 local_4bc;
  int local_4b8;
  int local_4b4;
  undefined8 *local_4b0;
  long local_4a8;
  undefined4 local_49c;
  long local_498;
  float *local_490;
  undefined4 local_484;
  int local_480;
  int local_47c;
  undefined8 *local_478;
  long local_470;
  undefined4 local_464;
  long local_460;
  float *local_458;
  undefined4 local_44c;
  int local_448;
  int local_444;
  undefined8 *local_440;
  long local_438;
  undefined4 local_42c;
  long local_428;
  float *local_420;
  undefined4 local_414;
  int local_410;
  int local_40c;
  undefined8 *local_408;
  long local_400;
  undefined4 local_3f4;
  long local_3f0;
  float *local_3e8;
  undefined4 local_3dc;
  int local_3d8;
  int local_3d4;
  undefined8 *local_3d0;
  long local_3c8;
  undefined4 local_3bc;
  long local_3b8;
  long local_3b0;
  undefined4 local_3a4;
  int local_3a0;
  int local_39c;
  undefined8 *local_398;
  undefined4 local_38c;
  long local_388;
  undefined4 local_37c;
  long local_378;
  undefined4 local_36c;
  long local_368;
  undefined4 local_35c;
  long local_358;
  undefined4 local_34c;
  long local_348;
  undefined4 local_33c;
  long local_338;
  undefined4 local_32c;
  long local_328;
  undefined4 local_31c;
  long local_318;
  undefined4 local_30c;
  long local_308;
  undefined8 *local_2a8;
  undefined8 *local_298;
  undefined8 *local_288;
  undefined8 *local_278;
  undefined8 *local_268;
  undefined8 *local_258;
  undefined8 *local_248;
  undefined8 *local_238;
  undefined8 *local_228;
  int local_134;
  undefined8 *local_130;
  int local_124;
  int local_114;
  int local_104;
  long *local_100;
  int local_f4;
  long *local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float *local_b0;
  float *local_a8;
  float *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_830 = *(int *)((long)in_RDI + 0x2c);
  local_834 = (int)in_RDI[6];
  local_838 = *(int *)((long)in_RDI + 0x34);
  local_83c = (int)in_RDI[7];
  local_840 = (int)in_RDI[3];
  local_820 = in_RDX;
  local_818 = in_RSI;
  local_810 = in_RDI;
  if (((int)in_RDI[5] == 2) && ((int)in_RSI[5] == 1)) {
    for (local_844 = 0; local_844 < local_834; local_844 = local_844 + 1) {
      local_100 = local_810;
      local_104 = local_844;
      local_850 = (float *)(*local_810 +
                           (long)*(int *)((long)local_810 + 0x2c) * (long)local_844 * local_810[2]);
      local_f0 = local_820;
      local_f4 = local_844;
      local_858 = (float *)(*local_820 +
                           (long)*(int *)((long)local_820 + 0x2c) * (long)local_844 * local_820[2]);
      local_7f8 = (long)local_844;
      local_7f0 = local_818;
      local_85c = *(float *)(*local_818 + local_7f8 * 4);
      if (local_840 == 4) {
        local_748 = local_818;
        local_a0 = (float *)(*local_818 + (long)(local_844 << 2) * 4);
        local_d08 = *(float (*) [2])local_a0;
        afStack_d00._0_8_ = *(undefined8 *)(local_a0 + 2);
      }
      else {
        local_d08[1] = local_85c;
        local_d08[0] = local_85c;
        afStack_d00[1] = local_85c;
        afStack_d00[0] = local_85c;
        local_5a8 = local_85c;
        fStack_5a4 = local_85c;
        fStack_5a0 = local_85c;
        fStack_59c = local_85c;
        local_598 = local_85c;
      }
      local_878[0] = local_d08[0];
      local_878[1] = local_d08[1];
      afStack_870[0] = afStack_d00[0];
      afStack_870[1] = afStack_d00[1];
      local_87c = local_830 * local_840;
      for (local_880 = 0; local_880 + 3 < local_87c; local_880 = local_880 + 4) {
        local_a8 = local_850;
        local_898 = *(float (*) [2])local_850;
        afStack_890._0_8_ = *(undefined8 *)(local_850 + 2);
        afVar3 = BinaryOp_x86_functor::binary_op_add::func_pack4
                           (local_829,(__m128 *)local_898,(__m128 *)local_878);
        local_18 = afVar3._0_8_;
        local_8a8._8_4_ = extraout_XMM0_Dc;
        local_8a8._0_8_ = local_18;
        local_8a8._12_4_ = extraout_XMM0_Dd;
        local_8 = local_858;
        uStack_10 = local_8a8._8_8_;
        *(undefined8 *)local_858 = local_18;
        *(undefined8 *)(local_858 + 2) = local_8a8._8_8_;
        local_850 = local_850 + 4;
        local_858 = local_858 + 4;
      }
      for (; local_880 < local_87c; local_880 = local_880 + 1) {
        fVar2 = BinaryOp_x86_functor::binary_op_add::func(local_829,local_850,&local_85c);
        *local_858 = fVar2;
        local_850 = local_850 + 1;
        local_858 = local_858 + 1;
      }
    }
  }
  if ((((int)local_810[5] == 3) || ((int)local_810[5] == 4)) && ((int)local_818[5] == 1)) {
    for (local_8ac = 0; local_8ac < local_83c; local_8ac = local_8ac + 1) {
      local_778 = &local_900;
      local_47c = *(int *)((long)local_810 + 0x2c);
      local_480 = (int)local_810[6];
      local_484 = *(undefined4 *)((long)local_810 + 0x34);
      local_8b8 = (float *)(*local_810 + local_810[8] * (long)local_8ac * local_810[2]);
      local_498 = local_810[2];
      local_49c = (undefined4)local_810[3];
      local_4a8 = local_810[4];
      local_478 = &local_900;
      local_348 = (long)local_47c * (long)local_480 * local_498;
      local_750 = &local_900;
      local_718 = &local_900;
      local_658 = &local_950;
      local_55c = *(int *)((long)local_820 + 0x2c);
      local_560 = (int)local_820[6];
      local_564 = *(undefined4 *)((long)local_820 + 0x34);
      local_908 = (float *)(*local_820 + local_820[8] * (long)local_8ac * local_820[2]);
      local_578 = local_820[2];
      local_57c = (undefined4)local_820[3];
      local_588 = local_820[4];
      local_558 = &local_950;
      local_308 = (long)local_55c * (long)local_560 * local_578;
      local_630 = &local_950;
      local_710 = &local_950;
      local_8c8 = 0;
      local_8cc = 0;
      local_8d0 = 0;
      local_8d4 = 0;
      local_8e8 = 0;
      local_8f0 = 0;
      local_8f8 = 0;
      local_900 = 0;
      local_30c = 0x10;
      local_34c = 0x10;
      local_664 = local_8ac;
      local_665 = 1;
      local_784 = local_8ac;
      local_785 = 1;
      local_8c0 = 0;
      local_8d8 = 0;
      local_950 = 0;
      local_940 = 0;
      local_938 = 0;
      local_928 = 0;
      local_924 = 0;
      local_920 = 0;
      local_91c = 0;
      local_918 = 0;
      local_910 = 0;
      local_948 = 0;
      local_808 = (long)local_8ac;
      local_954 = *(float *)(*local_818 + local_808 * 4);
      if (local_840 == 4) {
        local_b0 = (float *)(*local_818 + (long)(local_8ac << 2) * 4);
        local_d68 = *(float (*) [2])local_b0;
        afStack_d60._0_8_ = *(undefined8 *)(local_b0 + 2);
      }
      else {
        local_d68[1] = local_954;
        local_d68[0] = local_954;
        afStack_d60[1] = local_954;
        afStack_d60[0] = local_954;
        local_5c8 = local_954;
        fStack_5c4 = local_954;
        fStack_5c0 = local_954;
        fStack_5bc = local_954;
        local_5b8 = local_954;
      }
      local_968[0] = local_d68[0];
      local_968[1] = local_d68[1];
      afStack_960[0] = afStack_d60[0];
      afStack_960[1] = afStack_d60[1];
      local_96c = local_830 * local_834 * local_838 * local_840;
      local_570 = local_908;
      local_490 = local_8b8;
      local_238 = local_710;
      local_228 = local_718;
      local_930 = local_588;
      local_8e0 = local_4a8;
      for (local_970 = 0; local_970 + 3 < local_96c; local_970 = local_970 + 4) {
        local_b8 = local_8b8;
        local_988 = *(float (*) [2])local_8b8;
        afStack_980._0_8_ = *(undefined8 *)(local_8b8 + 2);
        afVar3 = BinaryOp_x86_functor::binary_op_add::func_pack4
                           (local_829,(__m128 *)local_988,(__m128 *)local_968);
        local_38 = afVar3._0_8_;
        local_998._8_4_ = extraout_XMM0_Dc_00;
        local_998._0_8_ = local_38;
        local_998._12_4_ = extraout_XMM0_Dd_00;
        local_20 = local_908;
        uStack_30 = local_998._8_8_;
        *(undefined8 *)local_908 = local_38;
        *(undefined8 *)(local_908 + 2) = local_998._8_8_;
        local_8b8 = local_8b8 + 4;
        local_908 = local_908 + 4;
      }
      for (; local_970 < local_96c; local_970 = local_970 + 1) {
        fVar2 = BinaryOp_x86_functor::binary_op_add::func(local_829,local_8b8,&local_954);
        *local_908 = fVar2;
        local_8b8 = local_8b8 + 1;
        local_908 = local_908 + 1;
      }
    }
  }
  if (((int)local_810[5] == 3) && ((int)local_818[5] == 2)) {
    for (local_99c = 0; local_99c < local_83c; local_99c = local_99c + 1) {
      local_790 = &local_9f0;
      local_444 = *(int *)((long)local_810 + 0x2c);
      local_448 = (int)local_810[6];
      local_44c = *(undefined4 *)((long)local_810 + 0x34);
      local_9a8 = (float *)(*local_810 + local_810[8] * (long)local_99c * local_810[2]);
      local_460 = local_810[2];
      local_464 = (undefined4)local_810[3];
      local_470 = local_810[4];
      local_440 = &local_9f0;
      local_358 = (long)local_444 * (long)local_448 * local_460;
      local_760 = &local_9f0;
      local_708 = &local_9f0;
      local_9f8 = *local_818 +
                  (long)*(int *)((long)local_818 + 0x2c) * (long)local_99c * local_818[2];
      local_678 = &local_a48;
      local_524 = *(int *)((long)local_820 + 0x2c);
      local_528 = (int)local_820[6];
      local_52c = *(undefined4 *)((long)local_820 + 0x34);
      local_a00 = (float *)(*local_820 + local_820[8] * (long)local_99c * local_820[2]);
      local_540 = local_820[2];
      local_544 = (undefined4)local_820[3];
      local_550 = local_820[4];
      local_520 = &local_a48;
      local_318 = (long)local_524 * (long)local_528 * local_540;
      local_638 = &local_a48;
      local_700 = &local_a48;
      local_9b8 = 0;
      local_9bc = 0;
      local_9c0 = 0;
      local_9c4 = 0;
      local_9d8 = 0;
      local_9e0 = 0;
      local_9e8 = 0;
      local_9f0 = 0;
      local_114 = local_99c;
      local_31c = 0x10;
      local_35c = 0x10;
      local_684 = local_99c;
      local_685 = 1;
      local_79c = local_99c;
      local_79d = 1;
      local_9b0 = 0;
      local_9c8 = 0;
      local_a48 = 0;
      local_a38 = 0;
      local_a30 = 0;
      local_a20 = 0;
      local_a1c = 0;
      local_a18 = 0;
      local_a14 = 0;
      local_a10 = 0;
      local_a08 = 0;
      local_a40 = 0;
      local_a4c = local_830 * local_840;
      local_538 = local_a00;
      local_458 = local_9a8;
      local_258 = local_700;
      local_248 = local_708;
      local_a28 = local_550;
      local_9d0 = local_470;
      for (local_a50 = 0; local_a50 < local_834; local_a50 = local_a50 + 1) {
        local_a54 = *(float *)(local_9f8 + (long)local_a50 * 4);
        if (local_840 == 4) {
          local_c0 = (float *)(local_9f8 + (long)(local_a50 << 2) * 4);
          local_dc8 = *(float (*) [2])local_c0;
          afStack_dc0._0_8_ = *(undefined8 *)(local_c0 + 2);
        }
        else {
          local_dc8[1] = local_a54;
          local_dc8[0] = local_a54;
          afStack_dc0[1] = local_a54;
          afStack_dc0[0] = local_a54;
          local_5e8 = local_a54;
          fStack_5e4 = local_a54;
          fStack_5e0 = local_a54;
          fStack_5dc = local_a54;
          local_5d8 = local_a54;
        }
        local_a68[0] = local_dc8[0];
        local_a68[1] = local_dc8[1];
        afStack_a60[0] = afStack_dc0[0];
        afStack_a60[1] = afStack_dc0[1];
        for (local_a6c = 0; local_a6c + 3 < local_a4c; local_a6c = local_a6c + 4) {
          local_c8 = local_9a8;
          local_a88 = *(float (*) [2])local_9a8;
          afStack_a80._0_8_ = *(undefined8 *)(local_9a8 + 2);
          afVar3 = BinaryOp_x86_functor::binary_op_add::func_pack4
                             (local_829,(__m128 *)local_a88,(__m128 *)local_a68);
          local_58 = afVar3._0_8_;
          local_a98._8_4_ = extraout_XMM0_Dc_01;
          local_a98._0_8_ = local_58;
          local_a98._12_4_ = extraout_XMM0_Dd_01;
          local_40 = local_a00;
          uStack_50 = local_a98._8_8_;
          *(undefined8 *)local_a00 = local_58;
          *(undefined8 *)(local_a00 + 2) = local_a98._8_8_;
          local_9a8 = local_9a8 + 4;
          local_a00 = local_a00 + 4;
        }
        for (; local_a6c < local_a4c; local_a6c = local_a6c + 1) {
          fVar2 = BinaryOp_x86_functor::binary_op_add::func(local_829,local_9a8,&local_a54);
          *local_a00 = fVar2;
          local_9a8 = local_9a8 + 1;
          local_a00 = local_a00 + 1;
        }
      }
    }
  }
  if (((int)local_810[5] == 4) && ((int)local_818[5] == 2)) {
    for (local_a9c = 0; local_a9c < local_83c; local_a9c = local_a9c + 1) {
      local_7a8 = &local_af0;
      local_40c = *(int *)((long)local_810 + 0x2c);
      local_410 = (int)local_810[6];
      local_414 = *(undefined4 *)((long)local_810 + 0x34);
      local_aa8 = (float *)(*local_810 + local_810[8] * (long)local_a9c * local_810[2]);
      local_428 = local_810[2];
      local_42c = (undefined4)local_810[3];
      local_438 = local_810[4];
      local_408 = &local_af0;
      local_368 = (long)local_40c * (long)local_410 * local_428;
      local_768 = &local_af0;
      local_6f8 = &local_af0;
      local_af8 = *local_818 +
                  (long)*(int *)((long)local_818 + 0x2c) * (long)local_a9c * local_818[2];
      local_698 = &local_b48;
      local_4ec = *(int *)((long)local_820 + 0x2c);
      local_4f0 = (int)local_820[6];
      local_4f4 = *(undefined4 *)((long)local_820 + 0x34);
      local_b00 = (float *)(*local_820 + local_820[8] * (long)local_a9c * local_820[2]);
      local_508 = local_820[2];
      local_50c = (undefined4)local_820[3];
      local_518 = local_820[4];
      local_4e8 = &local_b48;
      local_328 = (long)local_4ec * (long)local_4f0 * local_508;
      local_640 = &local_b48;
      local_6f0 = &local_b48;
      local_ab8 = 0;
      local_abc = 0;
      local_ac0 = 0;
      local_ac4 = 0;
      local_ad8 = 0;
      local_ae0 = 0;
      local_ae8 = 0;
      local_af0 = 0;
      local_124 = local_a9c;
      local_32c = 0x10;
      local_36c = 0x10;
      local_6a4 = local_a9c;
      local_6a5 = 1;
      local_7b4 = local_a9c;
      local_7b5 = 1;
      local_ab0 = 0;
      local_ac8 = 0;
      local_b48 = 0;
      local_b38 = 0;
      local_b30 = 0;
      local_b20 = 0;
      local_b1c = 0;
      local_b18 = 0;
      local_b14 = 0;
      local_b10 = 0;
      local_b08 = 0;
      local_b40 = 0;
      local_b4c = local_830 * local_834 * local_840;
      local_500 = local_b00;
      local_420 = local_aa8;
      local_278 = local_6f0;
      local_268 = local_6f8;
      local_b28 = local_518;
      local_ad0 = local_438;
      for (local_b50 = 0; local_b50 < local_838; local_b50 = local_b50 + 1) {
        local_b54 = *(float *)(local_af8 + (long)local_b50 * 4);
        if (local_840 == 4) {
          local_d0 = (float *)(local_af8 + (long)(local_b50 << 2) * 4);
          local_e28 = *(float (*) [2])local_d0;
          afStack_e20._0_8_ = *(undefined8 *)(local_d0 + 2);
        }
        else {
          local_e28[1] = local_b54;
          local_e28[0] = local_b54;
          afStack_e20[1] = local_b54;
          afStack_e20[0] = local_b54;
          local_608 = local_b54;
          fStack_604 = local_b54;
          fStack_600 = local_b54;
          fStack_5fc = local_b54;
          local_5f8 = local_b54;
        }
        local_b68[0] = local_e28[0];
        local_b68[1] = local_e28[1];
        afStack_b60[0] = afStack_e20[0];
        afStack_b60[1] = afStack_e20[1];
        for (local_b6c = 0; local_b6c + 3 < local_b4c; local_b6c = local_b6c + 4) {
          local_d8 = local_aa8;
          local_b88 = *(float (*) [2])local_aa8;
          afStack_b80._0_8_ = *(undefined8 *)(local_aa8 + 2);
          afVar3 = BinaryOp_x86_functor::binary_op_add::func_pack4
                             (local_829,(__m128 *)local_b88,(__m128 *)local_b68);
          local_78 = afVar3._0_8_;
          local_b98._8_4_ = extraout_XMM0_Dc_02;
          local_b98._0_8_ = local_78;
          local_b98._12_4_ = extraout_XMM0_Dd_02;
          local_60 = local_b00;
          uStack_70 = local_b98._8_8_;
          *(undefined8 *)local_b00 = local_78;
          *(undefined8 *)(local_b00 + 2) = local_b98._8_8_;
          local_aa8 = local_aa8 + 4;
          local_b00 = local_b00 + 4;
        }
        for (; local_b6c < local_b4c; local_b6c = local_b6c + 1) {
          fVar2 = BinaryOp_x86_functor::binary_op_add::func(local_829,local_aa8,&local_b54);
          *local_b00 = fVar2;
          local_aa8 = local_aa8 + 1;
          local_b00 = local_b00 + 1;
        }
      }
    }
  }
  if (((int)local_810[5] == 4) && ((int)local_818[5] == 3)) {
    for (local_b9c = 0; local_b9c < local_83c; local_b9c = local_b9c + 1) {
      local_7c0 = &local_bf0;
      local_3d4 = *(int *)((long)local_810 + 0x2c);
      local_3d8 = (int)local_810[6];
      local_3dc = *(undefined4 *)((long)local_810 + 0x34);
      local_ba8 = (float *)(*local_810 + local_810[8] * (long)local_b9c * local_810[2]);
      local_3f0 = local_810[2];
      local_3f4 = (undefined4)local_810[3];
      local_400 = local_810[4];
      local_3d0 = &local_bf0;
      local_378 = (long)local_3d4 * (long)local_3d8 * local_3f0;
      local_770 = &local_bf0;
      local_6e8 = &local_bf0;
      local_6b8 = &local_c40;
      local_4b4 = *(int *)((long)local_820 + 0x2c);
      local_4b8 = (int)local_820[6];
      local_4bc = *(undefined4 *)((long)local_820 + 0x34);
      local_bf8 = (float *)(*local_820 + local_820[8] * (long)local_b9c * local_820[2]);
      local_4d0 = local_820[2];
      local_4d4 = (undefined4)local_820[3];
      local_4e0 = local_820[4];
      local_4b0 = &local_c40;
      local_338 = (long)local_4b4 * (long)local_4b8 * local_4d0;
      local_648 = &local_c40;
      local_6e0 = &local_c40;
      local_bb8 = 0;
      local_bbc = 0;
      local_bc0 = 0;
      local_bc4 = 0;
      local_bd8 = 0;
      local_be0 = 0;
      local_be8 = 0;
      local_bf0 = 0;
      local_33c = 0x10;
      local_37c = 0x10;
      local_6c4 = local_b9c;
      local_6c5 = 1;
      local_7cc = local_b9c;
      local_7cd = 1;
      local_bb0 = 0;
      local_bc8 = 0;
      local_c40 = 0;
      local_c30 = 0;
      local_c28 = 0;
      local_c18 = 0;
      local_c14 = 0;
      local_c10 = 0;
      local_c0c = 0;
      local_c08 = 0;
      local_c00 = 0;
      local_c38 = 0;
      local_c44 = local_830 * local_840;
      local_4c8 = local_bf8;
      local_3e8 = local_ba8;
      local_298 = local_6e0;
      local_288 = local_6e8;
      local_c20 = local_4e0;
      local_bd0 = local_400;
      for (local_c48 = 0; local_c48 < local_838; local_c48 = local_c48 + 1) {
        local_7d8 = &local_c98;
        local_39c = *(int *)((long)local_818 + 0x2c);
        local_3a0 = (int)local_818[6];
        local_3a4 = *(undefined4 *)((long)local_818 + 0x34);
        local_3b0 = *local_818 + local_818[8] * (long)local_b9c * local_818[2];
        local_3b8 = local_818[2];
        local_3bc = (undefined4)local_818[3];
        local_3c8 = local_818[4];
        local_398 = &local_c98;
        local_388 = (long)local_39c * (long)local_3a0 * local_3b8;
        local_130 = &local_c98;
        local_c50 = local_3b0 + (long)local_39c * (long)local_c48 * local_3b8;
        local_6d8 = &local_c98;
        local_134 = local_c48;
        local_38c = 0x10;
        local_7e4 = local_b9c;
        local_7e5 = 1;
        local_c98 = 0;
        local_c88 = 0;
        local_c80 = 0;
        local_c70 = 0;
        local_c6c = 0;
        local_c68 = 0;
        local_c64 = 0;
        local_c60 = 0;
        local_c58 = 0;
        local_c90 = 0;
        local_2a8 = local_6d8;
        local_c78 = local_3c8;
        for (local_ca8 = 0; local_ca8 < local_834; local_ca8 = local_ca8 + 1) {
          local_cac = *(float *)(local_c50 + (long)local_ca8 * 4);
          if (local_840 == 4) {
            local_e0 = (float *)(local_c50 + (long)(local_ca8 << 2) * 4);
            local_eb8 = *(float (*) [2])local_e0;
            afStack_eb0._0_8_ = *(undefined8 *)(local_e0 + 2);
          }
          else {
            local_eb8[1] = local_cac;
            local_eb8[0] = local_cac;
            afStack_eb0[1] = local_cac;
            afStack_eb0[0] = local_cac;
            local_628 = local_cac;
            fStack_624 = local_cac;
            fStack_620 = local_cac;
            fStack_61c = local_cac;
            local_618 = local_cac;
          }
          local_cc8[0] = local_eb8[0];
          local_cc8[1] = local_eb8[1];
          afStack_cc0[0] = afStack_eb0[0];
          afStack_cc0[1] = afStack_eb0[1];
          for (local_ccc = 0; local_ccc + 3 < local_c44; local_ccc = local_ccc + 4) {
            local_e8 = local_ba8;
            local_ce8 = *(float (*) [2])local_ba8;
            afStack_ce0._0_8_ = *(undefined8 *)(local_ba8 + 2);
            afVar3 = BinaryOp_x86_functor::binary_op_add::func_pack4
                               (local_829,(__m128 *)local_ce8,(__m128 *)local_cc8);
            local_98 = afVar3._0_8_;
            auVar1._8_4_ = extraout_XMM0_Dc_03;
            auVar1._0_8_ = local_98;
            auVar1._12_4_ = extraout_XMM0_Dd_03;
            local_80 = local_bf8;
            uStack_cf0 = auVar1._8_8_;
            uStack_90 = uStack_cf0;
            *(undefined8 *)local_bf8 = local_98;
            *(undefined8 *)(local_bf8 + 2) = uStack_cf0;
            local_ba8 = local_ba8 + 4;
            local_bf8 = local_bf8 + 4;
          }
          for (; local_ccc < local_c44; local_ccc = local_ccc + 1) {
            fVar2 = BinaryOp_x86_functor::binary_op_add::func(local_829,local_ba8,&local_cac);
            *local_bf8 = fVar2;
            local_ba8 = local_ba8 + 1;
            local_bf8 = local_bf8 + 1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int binary_op_broadcast_inner(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;

    if (a.dims == 2 && b.dims == 1)
    {
        // type 8
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; y++)
        {
            const float* ptr = a.row(y);
            float* outptr = c.row(y);

            const float _b = b[y];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + y * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if ((a.dims == 3 || a.dims == 4) && b.dims == 1)
    {
        // type 9 11
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const float _b = b[q];
#if __SSE2__
            __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)b + q * 4) : _mm_set1_ps(_b);
#if __AVX__
            __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
            __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            const int size = w * h * d * elempack;

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _outp = op.func_pack16(_p, _b_512);
                _mm512_storeu_ps(outptr, _outp);
                ptr += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = op.func_pack8(_p, _b_256);
                _mm256_storeu_ps(outptr, _outp);
                ptr += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = op.func_pack4(_p, _b_128);
                _mm_storeu_ps(outptr, _outp);
                ptr += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = op.func(*ptr, _b);
                ptr += 1;
                outptr += 1;
            }
        }
    }

    if (a.dims == 3 && b.dims == 2)
    {
        // type 10
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int y = 0; y < h; y++)
            {
                const float _b = ptr1[y];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 2)
    {
        // type 12
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            const float* ptr1 = b.row(q);
            float* outptr = c.channel(q);

            const int size = w * h * elempack;

            for (int z = 0; z < d; z++)
            {
                const float _b = ptr1[z];
#if __SSE2__
                __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + z * 4) : _mm_set1_ps(_b);
#if __AVX__
                __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + z * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + z * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _outp = op.func_pack16(_p, _b_512);
                    _mm512_storeu_ps(outptr, _outp);
                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _outp = op.func_pack8(_p, _b_256);
                    _mm256_storeu_ps(outptr, _outp);
                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _outp = op.func_pack4(_p, _b_128);
                    _mm_storeu_ps(outptr, _outp);
                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = op.func(*ptr, _b);
                    ptr += 1;
                    outptr += 1;
                }
            }
        }
    }

    if (a.dims == 4 && b.dims == 3)
    {
        // type 13
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = a.channel(q);
            float* outptr = c.channel(q);

            const int size = w * elempack;

            for (int z = 0; z < d; z++)
            {
                const float* ptr1 = b.channel(q).row(z);

                for (int y = 0; y < h; y++)
                {
                    const float _b = ptr1[y];
#if __SSE2__
                    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps((const float*)ptr1 + y * 4) : _mm_set1_ps(_b);
#if __AVX__
                    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps((const float*)ptr1 + y * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
                    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps((const float*)ptr1 + y * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        __m512 _outp = op.func_pack16(_p, _b_512);
                        _mm512_storeu_ps(outptr, _outp);
                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _outp = op.func_pack8(_p, _b_256);
                        _mm256_storeu_ps(outptr, _outp);
                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        __m128 _outp = op.func_pack4(_p, _b_128);
                        _mm_storeu_ps(outptr, _outp);
                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr = op.func(*ptr, _b);
                        ptr += 1;
                        outptr += 1;
                    }
                }
            }
        }
    }

    return 0;
}